

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v5::vprint_rgb(rgb fd,string_view format,format_args args)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  char cVar5;
  char escape_fd [20];
  ulong local_48;
  ulong uStack_40;
  uint local_38;
  
  local_48 = CONCAT17((char)(((uint3)fd & 0xff) * 0x29 >> 0xc),0x3b323b38335b1b) |
             0x3000000000000000;
  uVar4 = ((uint3)fd & 0xff) / 10;
  cVar5 = (char)uVar4;
  uVar1 = (uint3)fd >> 8 & 0xff;
  uVar2 = uVar1 / 10;
  cVar3 = (char)uVar2;
  uStack_40 = CONCAT17((char)((uint)((uint3)fd >> 0x10) * 0x29 >> 0xc),
                       (int7)CONCAT26(0x303b,CONCAT15(fd.g + cVar3 * -10,
                                                      CONCAT14(cVar3 + ((byte)(uVar2 / 5) & 6) * -5,
                                                               CONCAT13((char)(uVar1 * 0x29 >> 0xc),
                                                                        (int3)CONCAT62(
                                                  0x303b3030303b,
                                                  CONCAT11(fd.r + cVar5 * -10,
                                                           cVar5 + ((byte)(uVar4 / 5) & 6) * -5) |
                                                  0x30)))) | 0x3030003000)) | 0x3000300000000000;
  uVar1 = ((uint3)fd >> 0x10) / 10;
  cVar3 = (char)uVar1;
  local_38 = CONCAT22(0x6d,CONCAT11(fd.b + cVar3 * -10,cVar3 + ((byte)(uVar1 / 5) & 6) * -5) | 0x30)
             | 0x3000;
  fputs((char *)&local_48,_stdout);
  vprint((FILE *)_stdout,format,args);
  fputs("\x1b[0m",_stdout);
  return;
}

Assistant:

FMT_FUNC void vprint_rgb(rgb fd, string_view format, format_args args) {
  char escape_fd[] = "\x1b[38;2;000;000;000m";
  internal::to_esc(fd.r, escape_fd, 7);
  internal::to_esc(fd.g, escape_fd, 11);
  internal::to_esc(fd.b, escape_fd, 15);

  std::fputs(escape_fd, stdout);
  vprint(format, args);
  std::fputs(internal::data::RESET_COLOR, stdout);
}